

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O1

void cconv_array_tab(CTState *cts,CType *d,uint8_t *dp,GCtab *t,CTInfo flags)

{
  uint uVar1;
  uint uVar2;
  CType *pCVar3;
  CTInfo CVar4;
  TValue *o;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  pCVar3 = cts->tab;
  CVar4 = d->info;
  uVar1 = d->size;
  uVar2 = pCVar3[(ushort)CVar4].size;
  lVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  do {
    if (uVar6 < t->asize) {
      o = (TValue *)((t->array).ptr64 + lVar5);
    }
    else {
      o = lj_tab_getinth(t,(int32_t)uVar6);
    }
    if ((o == (TValue *)0x0) || (o->u64 == 0xffffffffffffffff)) {
      bVar8 = uVar6 != 0;
    }
    else {
      if (uVar1 <= uVar7) {
        cconv_err_initov(cts,d);
      }
      lj_cconv_ct_tv(cts,pCVar3 + (ushort)CVar4,dp + uVar7,o,flags);
      uVar7 = uVar7 + uVar2;
      bVar8 = false;
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 8;
  } while (!bVar8);
  if (uVar1 != 0xffffffff) {
    if (uVar7 != uVar2) {
      memset(dp + uVar7,0,(ulong)(uVar1 - uVar7));
      return;
    }
    for (; uVar7 < uVar1; uVar7 = uVar7 + uVar2) {
      memcpy(dp + uVar7,dp,(ulong)uVar2);
    }
  }
  return;
}

Assistant:

static void cconv_array_tab(CTState *cts, CType *d,
			    uint8_t *dp, GCtab *t, CTInfo flags)
{
  int32_t i;
  CType *dc = ctype_rawchild(cts, d);  /* Array element type. */
  CTSize size = d->size, esize = dc->size, ofs = 0;
  for (i = 0; ; i++) {
    TValue *tv = (TValue *)lj_tab_getint(t, i);
    if (!tv || tvisnil(tv)) {
      if (i == 0) continue;  /* Try again for 1-based tables. */
      break;  /* Stop at first nil. */
    }
    if (ofs >= size)
      cconv_err_initov(cts, d);
    lj_cconv_ct_tv(cts, dc, dp + ofs, tv, flags);
    ofs += esize;
  }
  if (size != CTSIZE_INVALID) {  /* Only fill up arrays with known size. */
    if (ofs == esize) {  /* Replicate a single element. */
      for (; ofs < size; ofs += esize) memcpy(dp + ofs, dp, esize);
    } else {  /* Otherwise fill the remainder with zero. */
      memset(dp + ofs, 0, size - ofs);
    }
  }
}